

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserErrors
xmlParseExternalEntityPrivate
          (xmlDocPtr doc,xmlParserCtxtPtr oldctxt,xmlSAXHandlerPtr sax,void *user_data,int depth,
          xmlChar *URL,xmlChar *ID,xmlNodePtr *list)

{
  xmlChar xVar1;
  xmlDictPtr pxVar2;
  xmlParserInputPtr pxVar3;
  xmlCharEncoding enc;
  int iVar4;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc_00;
  xmlChar *pxVar5;
  xmlNodePtr cur;
  _xmlNode *p_Var6;
  unsigned_long uVar7;
  xmlParserErrors xVar8;
  xmlChar start [4];
  xmlChar local_34;
  xmlChar local_33;
  xmlChar local_32;
  xmlChar local_31;
  
  if ((depth < 0x29) ||
     (((xVar8 = XML_ERR_ENTITY_LOOP, oldctxt != (xmlParserCtxtPtr)0x0 && (depth < 0x401)) &&
      ((oldctxt->options & 0x80000U) != 0)))) {
    if (list != (xmlNodePtr *)0x0) {
      *list = (xmlNodePtr)0x0;
    }
    xVar8 = XML_ERR_INTERNAL_ERROR;
    if ((doc != (xmlDocPtr)0x0) && (URL != (xmlChar *)0x0 || ID != (xmlChar *)0x0)) {
      ctxt = xmlCreateEntityParserCtxtInternal(sax,user_data,URL,ID,(xmlChar *)0x0,oldctxt);
      if (ctxt == (xmlParserCtxtPtr)0x0) {
        xVar8 = XML_WAR_UNDECLARED_ENTITY;
      }
      else {
        xmlDetectSAX2(ctxt);
        doc_00 = xmlNewDoc("1.0");
        if (doc_00 == (xmlDocPtr)0x0) {
          xmlFreeParserCtxt(ctxt);
        }
        else {
          doc_00->properties = 0x40;
          doc_00->intSubset = doc->intSubset;
          doc_00->extSubset = doc->extSubset;
          pxVar2 = doc->dict;
          if (pxVar2 != (xmlDictPtr)0x0) {
            doc_00->dict = pxVar2;
            xmlDictReference(pxVar2);
          }
          if (doc->URL != (xmlChar *)0x0) {
            pxVar5 = xmlStrdup(doc->URL);
            doc_00->URL = pxVar5;
          }
          cur = xmlNewDocNode(doc_00,(xmlNsPtr)0x0,(xmlChar *)"pseudoroot",(xmlChar *)0x0);
          if (cur == (xmlNodePtr)0x0) {
            if (sax != (xmlSAXHandlerPtr)0x0) {
              xmlFreeParserCtxt(ctxt);
            }
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
          }
          else {
            xmlAddChild((xmlNodePtr)doc_00,cur);
            nodePush(ctxt,doc_00->children);
            ctxt->myDoc = doc;
            cur->doc = doc;
            if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)
               ) {
              xmlGROW(ctxt);
            }
            pxVar5 = ctxt->input->cur;
            if (3 < (long)ctxt->input->end - (long)pxVar5) {
              local_34 = *pxVar5;
              local_33 = pxVar5[1];
              local_32 = pxVar5[2];
              local_31 = pxVar5[3];
              enc = xmlDetectCharEncoding(&local_34,4);
              if (enc != XML_CHAR_ENCODING_NONE) {
                xmlSwitchEncoding(ctxt,enc);
              }
            }
            pxVar5 = ctxt->input->cur;
            if (((((*pxVar5 == '<') && (pxVar5[1] == '?')) && (pxVar5[2] == 'x')) &&
                ((pxVar5[3] == 'm' && (pxVar5[4] == 'l')))) &&
               (((ulong)pxVar5[5] < 0x21 && ((0x100002600U >> ((ulong)pxVar5[5] & 0x3f) & 1) != 0)))
               ) {
              xmlParseTextDecl(ctxt);
              iVar4 = xmlStrEqual(oldctxt->version,"1.0");
              if ((iVar4 != 0) && (iVar4 = xmlStrEqual(ctxt->input->version,"1.0"), iVar4 == 0)) {
                xmlFatalErrMsg(ctxt,XML_ERR_VERSION_MISMATCH,
                               "Version mismatch between document and entity\n");
              }
            }
            ctxt->instate = XML_PARSER_CONTENT;
            ctxt->depth = depth;
            if (oldctxt == (xmlParserCtxtPtr)0x0) {
              ctxt->_private = (void *)0x0;
              ctxt->validate = 0;
              ctxt->external = 2;
              ctxt->loadsubset = 0;
            }
            else {
              ctxt->_private = oldctxt->_private;
              ctxt->loadsubset = oldctxt->loadsubset;
              ctxt->validate = oldctxt->validate;
              ctxt->valid = oldctxt->valid;
              ctxt->replaceEntities = oldctxt->replaceEntities;
              if (oldctxt->validate != 0) {
                (ctxt->vctxt).error = (oldctxt->vctxt).error;
                (ctxt->vctxt).warning = (oldctxt->vctxt).warning;
                (ctxt->vctxt).userData = (oldctxt->vctxt).userData;
              }
              ctxt->external = oldctxt->external;
              if (ctxt->dict != (xmlDictPtr)0x0) {
                xmlDictFree(ctxt->dict);
              }
              pxVar2 = oldctxt->dict;
              ctxt->dict = pxVar2;
              pxVar5 = xmlDictLookup(pxVar2,"xml",3);
              ctxt->str_xml = pxVar5;
              pxVar5 = xmlDictLookup(ctxt->dict,"xmlns",5);
              ctxt->str_xmlns = pxVar5;
              pxVar5 = xmlDictLookup(ctxt->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                     0x24);
              ctxt->str_xml_ns = pxVar5;
              ctxt->dictNames = oldctxt->dictNames;
              ctxt->attsDefault = oldctxt->attsDefault;
              ctxt->attsSpecial = oldctxt->attsSpecial;
              ctxt->linenumbers = oldctxt->linenumbers;
              ctxt->record_info = oldctxt->record_info;
              (ctxt->node_seq).maximum = (oldctxt->node_seq).maximum;
              (ctxt->node_seq).length = (oldctxt->node_seq).length;
              (ctxt->node_seq).buffer = (oldctxt->node_seq).buffer;
            }
            xmlParseContent(ctxt);
            pxVar5 = ctxt->input->cur;
            xVar1 = *pxVar5;
            if (xVar1 != '\0') {
              xVar8 = XML_ERR_EXTRA_CONTENT;
              if ((xVar1 == '<') && (xVar8 = XML_ERR_NOT_WELL_BALANCED, pxVar5[1] != '/')) {
                xVar8 = XML_ERR_EXTRA_CONTENT;
              }
              xmlFatalErr(ctxt,xVar8,(char *)0x0);
            }
            if (ctxt->node != doc_00->children) {
              xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
            }
            if (ctxt->wellFormed == 0) {
              xVar8 = ctxt->errNo + (uint)(ctxt->errNo == 0);
            }
            else {
              xVar8 = XML_ERR_OK;
              if (list != (xmlNodePtr *)0x0) {
                p_Var6 = doc_00->children->children;
                *list = p_Var6;
                for (; p_Var6 != (_xmlNode *)0x0; p_Var6 = p_Var6->next) {
                  p_Var6->parent = (_xmlNode *)0x0;
                }
                doc_00->children->children = (_xmlNode *)0x0;
                xVar8 = XML_ERR_OK;
              }
            }
            if (oldctxt != (xmlParserCtxtPtr)0x0) {
              oldctxt->nbentities = oldctxt->nbentities + ctxt->nbentities;
            }
            pxVar3 = ctxt->input;
            if (pxVar3 != (xmlParserInputPtr)0x0 && oldctxt != (xmlParserCtxtPtr)0x0) {
              uVar7 = oldctxt->sizeentities + pxVar3->consumed;
              oldctxt->sizeentities = uVar7;
              oldctxt->sizeentities = (unsigned_long)(pxVar3->cur + (uVar7 - (long)pxVar3->base));
            }
            if (oldctxt != (xmlParserCtxtPtr)0x0) {
              if ((ctxt->lastError).code != 0) {
                xmlCopyError(&ctxt->lastError,&oldctxt->lastError);
              }
              ctxt->dict = (xmlDictPtr)0x0;
              ctxt->attsDefault = (xmlHashTablePtr)0x0;
              ctxt->attsSpecial = (xmlHashTablePtr)0x0;
              oldctxt->validate = ctxt->validate;
              oldctxt->valid = ctxt->valid;
              (oldctxt->node_seq).maximum = (ctxt->node_seq).maximum;
              (oldctxt->node_seq).length = (ctxt->node_seq).length;
              (oldctxt->node_seq).buffer = (ctxt->node_seq).buffer;
            }
            (ctxt->node_seq).maximum = 0;
            (ctxt->node_seq).length = 0;
            (ctxt->node_seq).buffer = (xmlParserNodeInfo *)0x0;
            xmlFreeParserCtxt(ctxt);
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
          }
          xmlFreeDoc(doc_00);
        }
      }
    }
  }
  return xVar8;
}

Assistant:

static xmlParserErrors
xmlParseExternalEntityPrivate(xmlDocPtr doc, xmlParserCtxtPtr oldctxt,
	              xmlSAXHandlerPtr sax,
		      void *user_data, int depth, const xmlChar *URL,
		      const xmlChar *ID, xmlNodePtr *list) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr newDoc;
    xmlNodePtr newRoot;
    xmlParserErrors ret = XML_ERR_OK;
    xmlChar start[4];
    xmlCharEncoding enc;

    if (((depth > 40) &&
	((oldctxt == NULL) || (oldctxt->options & XML_PARSE_HUGE) == 0)) ||
	(depth > 1024)) {
	return(XML_ERR_ENTITY_LOOP);
    }

    if (list != NULL)
        *list = NULL;
    if ((URL == NULL) && (ID == NULL))
	return(XML_ERR_INTERNAL_ERROR);
    if (doc == NULL)
	return(XML_ERR_INTERNAL_ERROR);

    ctxt = xmlCreateEntityParserCtxtInternal(sax, user_data, URL, ID, NULL,
                                             oldctxt);
    if (ctxt == NULL) return(XML_WAR_UNDECLARED_ENTITY);
    xmlDetectSAX2(ctxt);

    newDoc = xmlNewDoc(BAD_CAST "1.0");
    if (newDoc == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(XML_ERR_INTERNAL_ERROR);
    }
    newDoc->properties = XML_DOC_INTERNAL;
    if (doc) {
        newDoc->intSubset = doc->intSubset;
        newDoc->extSubset = doc->extSubset;
        if (doc->dict) {
            newDoc->dict = doc->dict;
            xmlDictReference(newDoc->dict);
        }
        if (doc->URL != NULL) {
            newDoc->URL = xmlStrdup(doc->URL);
        }
    }
    newRoot = xmlNewDocNode(newDoc, NULL, BAD_CAST "pseudoroot", NULL);
    if (newRoot == NULL) {
	if (sax != NULL)
	xmlFreeParserCtxt(ctxt);
	newDoc->intSubset = NULL;
	newDoc->extSubset = NULL;
        xmlFreeDoc(newDoc);
	return(XML_ERR_INTERNAL_ERROR);
    }
    xmlAddChild((xmlNodePtr) newDoc, newRoot);
    nodePush(ctxt, newDoc->children);
    if (doc == NULL) {
        ctxt->myDoc = newDoc;
    } else {
        ctxt->myDoc = doc;
        newRoot->doc = doc;
    }

    /*
     * Get the 4 first bytes and decode the charset
     * if enc != XML_CHAR_ENCODING_NONE
     * plug some encoding conversion routines.
     */
    GROW;
    if ((ctxt->input->end - ctxt->input->cur) >= 4) {
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }

    /*
     * Parse a possible text declaration first
     */
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	xmlParseTextDecl(ctxt);
        /*
         * An XML-1.0 document can't reference an entity not XML-1.0
         */
        if ((xmlStrEqual(oldctxt->version, BAD_CAST "1.0")) &&
            (!xmlStrEqual(ctxt->input->version, BAD_CAST "1.0"))) {
            xmlFatalErrMsg(ctxt, XML_ERR_VERSION_MISMATCH,
                           "Version mismatch between document and entity\n");
        }
    }

    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->depth = depth;
    if (oldctxt != NULL) {
	ctxt->_private = oldctxt->_private;
	ctxt->loadsubset = oldctxt->loadsubset;
	ctxt->validate = oldctxt->validate;
	ctxt->valid = oldctxt->valid;
	ctxt->replaceEntities = oldctxt->replaceEntities;
        if (oldctxt->validate) {
            ctxt->vctxt.error = oldctxt->vctxt.error;
            ctxt->vctxt.warning = oldctxt->vctxt.warning;
            ctxt->vctxt.userData = oldctxt->vctxt.userData;
        }
	ctxt->external = oldctxt->external;
        if (ctxt->dict) xmlDictFree(ctxt->dict);
        ctxt->dict = oldctxt->dict;
        ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
        ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
        ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);
        ctxt->dictNames = oldctxt->dictNames;
        ctxt->attsDefault = oldctxt->attsDefault;
        ctxt->attsSpecial = oldctxt->attsSpecial;
        ctxt->linenumbers = oldctxt->linenumbers;
	ctxt->record_info = oldctxt->record_info;
	ctxt->node_seq.maximum = oldctxt->node_seq.maximum;
	ctxt->node_seq.length = oldctxt->node_seq.length;
	ctxt->node_seq.buffer = oldctxt->node_seq.buffer;
    } else {
	/*
	 * Doing validity checking on chunk without context
	 * doesn't make sense
	 */
	ctxt->_private = NULL;
	ctxt->validate = 0;
	ctxt->external = 2;
	ctxt->loadsubset = 0;
    }

    xmlParseContent(ctxt);

    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if (ctxt->node != newDoc->children) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
	if (list != NULL) {
	    xmlNodePtr cur;

	    /*
	     * Return the newly created nodeset after unlinking it from
	     * they pseudo parent.
	     */
	    cur = newDoc->children->children;
	    *list = cur;
	    while (cur != NULL) {
		cur->parent = NULL;
		cur = cur->next;
	    }
            newDoc->children->children = NULL;
	}
	ret = XML_ERR_OK;
    }

    /*
     * Record in the parent context the number of entities replacement
     * done when parsing that reference.
     */
    if (oldctxt != NULL)
        oldctxt->nbentities += ctxt->nbentities;

    /*
     * Also record the size of the entity parsed
     */
    if (ctxt->input != NULL && oldctxt != NULL) {
	oldctxt->sizeentities += ctxt->input->consumed;
	oldctxt->sizeentities += (ctxt->input->cur - ctxt->input->base);
    }
    /*
     * And record the last error if any
     */
    if ((oldctxt != NULL) && (ctxt->lastError.code != XML_ERR_OK))
        xmlCopyError(&ctxt->lastError, &oldctxt->lastError);

    if (oldctxt != NULL) {
        ctxt->dict = NULL;
        ctxt->attsDefault = NULL;
        ctxt->attsSpecial = NULL;
        oldctxt->validate = ctxt->validate;
        oldctxt->valid = ctxt->valid;
        oldctxt->node_seq.maximum = ctxt->node_seq.maximum;
        oldctxt->node_seq.length = ctxt->node_seq.length;
        oldctxt->node_seq.buffer = ctxt->node_seq.buffer;
    }
    ctxt->node_seq.maximum = 0;
    ctxt->node_seq.length = 0;
    ctxt->node_seq.buffer = NULL;
    xmlFreeParserCtxt(ctxt);
    newDoc->intSubset = NULL;
    newDoc->extSubset = NULL;
    xmlFreeDoc(newDoc);

    return(ret);
}